

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O3

void sptk::world::cdft(int n,int isgn,double *a,int *ip,double *w)

{
  if (-1 < isgn) {
    cftfsub(n,a,ip,*ip,w);
    return;
  }
  cftbsub(n,a,ip,*ip,w);
  return;
}

Assistant:

void cdft(int n, int isgn, double *a, int *ip, double *w) {
#if 0
  void cftfsub(int n, double *a, int *ip, int nw, double *w);
  void cftbsub(int n, double *a, int *ip, int nw, double *w);
#endif
  int nw;

  nw = ip[0];
  if (isgn >= 0) {
    cftfsub(n, a, ip, nw, w);
  } else {
    cftbsub(n, a, ip, nw, w);
  }
}